

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentTypeImpl.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DOMDocumentTypeImpl::DOMDocumentTypeImpl
          (DOMDocumentTypeImpl *this,DOMDocumentTypeImpl *other,bool heap,bool deep)

{
  int iVar1;
  DOMDocument *pDVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  (this->super_DOMDocumentType).super_DOMNode._vptr_DOMNode =
       (_func_int **)&PTR__DOMDocumentTypeImpl_0040fd08;
  (this->super_HasDOMNodeImpl)._vptr_HasDOMNodeImpl =
       (_func_int **)&PTR__DOMDocumentTypeImpl_0040fee8;
  (this->super_HasDOMParentImpl)._vptr_HasDOMParentImpl =
       (_func_int **)&PTR__DOMDocumentTypeImpl_0040ff18;
  (this->super_HasDOMChildImpl)._vptr_HasDOMChildImpl =
       (_func_int **)&PTR__DOMDocumentTypeImpl_0040ff48;
  DOMNodeImpl::DOMNodeImpl(&this->fNode,(DOMNode *)this,&other->fNode);
  DOMParentNode::DOMParentNode(&this->fParent,(DOMNode *)this,&other->fParent);
  DOMChildNode::DOMChildNode(&this->fChild,&other->fChild);
  this->fPublicId = (XMLCh *)0x0;
  this->fSystemId = (XMLCh *)0x0;
  this->fNotations = (DOMNamedNodeMapImpl *)0x0;
  this->fElements = (DOMNamedNodeMapImpl *)0x0;
  this->fName = (XMLCh *)0x0;
  this->fEntities = (DOMNamedNodeMapImpl *)0x0;
  this->fInternalSubset = (XMLCh *)0x0;
  this->fIntSubsetReading = other->fIntSubsetReading;
  this->fIsCreatedFromHeap = heap;
  this->fName = other->fName;
  this->fPublicId = other->fPublicId;
  this->fSystemId = other->fSystemId;
  this->fInternalSubset = other->fInternalSubset;
  pDVar2 = DOMNodeImpl::getOwnerDocument(&this->fNode);
  if (deep && pDVar2 != (DOMDocument *)0x0) {
    DOMParentNode::cloneChildren(&this->fParent,(DOMNode *)other);
  }
  iVar1 = (*(other->fEntities->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[10])
                    (other->fEntities,this);
  this->fEntities = (DOMNamedNodeMapImpl *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*(other->fNotations->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[10])
                    (other->fNotations,this);
  this->fNotations = (DOMNamedNodeMapImpl *)CONCAT44(extraout_var_00,iVar1);
  iVar1 = (*(other->fElements->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[10])
                    (other->fElements,this);
  this->fElements = (DOMNamedNodeMapImpl *)CONCAT44(extraout_var_01,iVar1);
  return;
}

Assistant:

DOMDocumentTypeImpl::DOMDocumentTypeImpl(const DOMDocumentTypeImpl &other, bool heap, bool deep)
    : fNode(this, other.fNode),
    fParent(this, other.fParent),
    fChild(other.fChild),
    fName(0),
    fEntities(0),
    fNotations(0),
    fElements(0),
    fPublicId(0),
    fSystemId(0),
    fInternalSubset(0),
    fIntSubsetReading(other.fIntSubsetReading),
    fIsCreatedFromHeap(heap)
{
    fName = other.fName;

    //DOM Level 2
    fPublicId        = other.fPublicId;
    fSystemId        = other.fSystemId;
    fInternalSubset  = other.fInternalSubset;

    if ((DOMDocumentImpl *)this->fNode.getOwnerDocument() && deep)
        fParent.cloneChildren(&other);

    fEntities = other.fEntities->cloneMap(this);
    fNotations= other.fNotations->cloneMap(this);
    fElements = other.fElements->cloneMap(this);
}